

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O0

int __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
::select_variables_101
          (solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
           *this,int r_size,int bkmin,int bkmax)

{
  bool bVar1;
  type prVar2;
  int local_28;
  int local_24;
  int i;
  int best;
  int sum;
  int bkmax_local;
  int bkmin_local;
  int r_size_local;
  solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  *this_local;
  
  i = 0;
  local_24 = -2;
  local_28 = -1;
  do {
    if (r_size <= local_28) {
      return local_24;
    }
    if ((bkmin <= i) && (i <= bkmax)) {
      local_24 = local_28;
    }
    if ((local_24 != -2) && (local_28 + -1 < r_size)) {
      prVar2 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
               ::operator[](&this->R,(long)(local_28 + 1));
      bVar1 = stop_iterating<baryonyx::itm::minimize_tag,float>(prVar2->value);
      if (bVar1) {
        return local_24;
      }
    }
    prVar2 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
             ::operator[](&this->R,(long)(local_28 + 1));
    i = prVar2->f + i;
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

int select_variables_101(const int r_size, int bkmin, int bkmax)
    {
        int sum = 0;
        int best = -2;

        for (int i = -1; i < r_size; ++i) {
            if (bkmin <= sum && sum <= bkmax)
                best = i;

            if (best != -2 && i - 1 < r_size &&
                stop_iterating<Mode>(R[i + 1].value))
                break;

            sum += R[i + 1].f;
        }

        return best;
    }